

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O3

void LongReadsDatastore::build_from_fastq
               (string *output_file,string *default_name,string *long_read_file,size_t min_size,
               int rle)

{
  size_type sVar1;
  bool bVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  runtime_error *prVar6;
  byte bVar7;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  initializer_list<ReadPosSize> __l;
  uint32_t size;
  string rleseq;
  uint64_t nReads;
  SDG_FILETYPE type;
  vector<ReadPosSize,_std::allocator<ReadPosSize>_> read_to_file_record;
  uint8_t k;
  uint64_t fPos;
  FastqRecord rec;
  ofstream ofs;
  FastqReader<FastqRecord> reader;
  ifstream fastq_ifstream;
  uint local_604;
  undefined1 *local_600;
  undefined8 local_5f8;
  undefined1 local_5f0;
  undefined7 uStack_5ef;
  long local_5e0;
  undefined2 local_5d2;
  vector<ReadPosSize,_std::allocator<ReadPosSize>_> local_5d0;
  ulong local_5b8;
  undefined8 local_5b0;
  size_t local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5a0;
  FastqRecord local_598;
  long local_510;
  filebuf local_508 [24];
  byte abStack_4f0 [216];
  ios_base local_418 [264];
  FastqReader<FastqRecord> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  byte abStack_218 [488];
  
  local_5e0 = 1;
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_238._M_string_length._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_238;
  std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::vector
            (&local_5d0,__l,(allocator_type *)&local_510);
  std::ofstream::ofstream(&local_510,(string *)output_file,_S_trunc|_S_out|_S_bin);
  if ((abStack_4f0[*(long *)(local_510 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to open output in ",0x19);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(output_file->_M_dataplus)._M_p,
                        output_file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar5);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_238,"Could not open ",output_file);
    std::runtime_error::runtime_error(prVar6,(string *)&local_238);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ostream::write((char *)&local_510,0x2232ec);
  std::ostream::write((char *)&local_510,0x2232ee);
  local_5d2 = 4;
  std::ostream::write((char *)&local_510,(long)&local_5d2);
  std::ostream::write((char *)&local_510,(long)&local_5e0);
  std::ostream::write((char *)&local_510,(long)&local_5b0);
  local_238._M_dataplus._M_p = (pointer)default_name->_M_string_length;
  std::ostream::write((char *)&local_510,(long)&local_238);
  std::ostream::write((char *)&local_510,(long)(default_name->_M_dataplus)._M_p);
  std::ifstream::ifstream(&local_238,(string *)long_read_file,_S_in);
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to open input in ",0x18);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(long_read_file->_M_dataplus)._M_p,
                        long_read_file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar5);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_310,
                   "Could not open ",long_read_file);
    std::runtime_error::runtime_error(prVar6,(string *)&local_310);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  FastqReader<FastqRecord>::FastqReader(&local_310,(FastxReaderParams)0x0,long_read_file);
  local_598.name._M_dataplus._M_p = (pointer)&local_598.name.field_2;
  local_598.name._M_string_length = 0;
  local_598.name.field_2._M_local_buf[0] = '\0';
  local_598.comment._M_dataplus._M_p = (pointer)&local_598.comment.field_2;
  local_598.comment._M_string_length = 0;
  local_598.comment.field_2._M_local_buf[0] = '\0';
  local_598.seq._M_dataplus._M_p = (pointer)&local_598.seq.field_2;
  local_598.seq._M_string_length = 0;
  local_598.seq.field_2._M_local_buf[0] = '\0';
  local_598.qual._M_dataplus._M_p = (pointer)&local_598.qual.field_2;
  local_598.qual._M_string_length = 0;
  local_598.qual.field_2._M_local_buf[0] = '\0';
  local_5a8 = min_size;
  do {
    bVar2 = FastqReader<FastqRecord>::next_record(&local_310,&local_598);
    if (!bVar2) {
      local_5b0 = std::ostream::tellp();
      local_600 = (undefined1 *)
                  ((long)local_5d0.super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_5d0.super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4);
      std::ostream::write((char *)&local_510,(long)&local_600);
      if (local_600 != (undefined1 *)0x0) {
        std::ostream::write((char *)&local_510,
                            (long)local_5d0.
                                  super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      }
      local_5b8 = local_5b8 & 0xffffffffffffff00;
      std::ostream::write((char *)&local_510,(long)&local_5b8);
      local_600 = (undefined1 *)0x0;
      std::ostream::write((char *)&local_510,(long)&local_600);
      if (local_600 != (undefined1 *)0x0) {
        std::ostream::write((char *)&local_510,0);
      }
      std::ostream::seekp(&local_510,6,0);
      std::ostream::write((char *)&local_510,(long)&local_5e0);
      std::ostream::write((char *)&local_510,(long)&local_5b0);
      std::ostream::flush();
      poVar3 = sdglib::OutputLog(INFO,true);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Built datastore with ",0x15);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," reads",6);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598.qual._M_dataplus._M_p != &local_598.qual.field_2) {
        operator_delete(local_598.qual._M_dataplus._M_p,
                        CONCAT71(local_598.qual.field_2._M_allocated_capacity._1_7_,
                                 local_598.qual.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598.seq._M_dataplus._M_p != &local_598.seq.field_2) {
        operator_delete(local_598.seq._M_dataplus._M_p,
                        CONCAT71(local_598.seq.field_2._M_allocated_capacity._1_7_,
                                 local_598.seq.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598.comment._M_dataplus._M_p != &local_598.comment.field_2) {
        operator_delete(local_598.comment._M_dataplus._M_p,
                        CONCAT71(local_598.comment.field_2._M_allocated_capacity._1_7_,
                                 local_598.comment.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598.name._M_dataplus._M_p != &local_598.name.field_2) {
        operator_delete(local_598.name._M_dataplus._M_p,
                        CONCAT71(local_598.name.field_2._M_allocated_capacity._1_7_,
                                 local_598.name.field_2._M_local_buf[0]) + 1);
      }
      FastqReader<FastqRecord>::~FastqReader(&local_310);
      std::ifstream::~ifstream(&local_238);
      local_510 = _VTT;
      *(undefined8 *)(local_508 + *(long *)(_VTT + -0x18) + -8) = _setbuf;
      std::filebuf::~filebuf(local_508);
      std::ios_base::~ios_base(local_418);
      if (local_5d0.super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5d0.super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_5d0.
                              super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_5d0.
                              super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    if (min_size <= local_598.seq._M_string_length && local_598.seq._M_string_length != 0) {
      local_600 = &local_5f0;
      local_5f8 = 0;
      local_5f0 = 0;
      std::__cxx11::string::reserve((ulong)&local_600);
      sVar1 = local_598.seq._M_string_length;
      if (local_598.seq._M_string_length != 0) {
        local_5a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_598.seq._M_dataplus._M_p;
        uVar10 = 0;
        iVar8 = 0;
        bVar7 = 0x20;
        do {
          bVar9 = local_5a0->_M_local_buf[uVar10];
          if (bVar9 < 0x61) {
            if (bVar9 < 0x47) {
              if ((bVar9 != 0x41) && (bVar9 != 0x43)) {
LAB_001929ea:
                bVar9 = 0x4e;
              }
            }
            else if ((bVar9 != 0x47) && (bVar9 != 0x54)) goto LAB_001929ea;
          }
          else if (bVar9 < 0x67) {
            if (bVar9 == 0x61) {
              bVar9 = 0x41;
            }
            else {
              if (bVar9 != 99) goto LAB_001929ea;
              bVar9 = 0x43;
            }
          }
          else if (bVar9 == 0x67) {
            bVar9 = 0x47;
          }
          else {
            if (bVar9 != 0x74) goto LAB_001929ea;
            bVar9 = 0x54;
          }
          if (rle == 0) {
            std::__cxx11::string::push_back('\0');
            bVar9 = bVar7;
          }
          else {
            iVar8 = iVar8 + 1;
            if (bVar9 != bVar7) {
              iVar8 = 1;
            }
            if (iVar8 <= rle) {
              std::__cxx11::string::push_back('\0');
            }
          }
          uVar10 = uVar10 + 1;
          bVar7 = bVar9;
        } while (sVar1 != uVar10);
      }
      local_604 = (uint)local_5f8;
      local_5b8 = std::ostream::tellp();
      min_size = local_5a8;
      std::vector<ReadPosSize,std::allocator<ReadPosSize>>::emplace_back<long,unsigned_int&>
                ((vector<ReadPosSize,std::allocator<ReadPosSize>> *)&local_5d0,(long *)&local_5b8,
                 &local_604);
      std::ostream::write((char *)&local_510,(long)local_600);
      if (local_600 != &local_5f0) {
        operator_delete(local_600,CONCAT71(uStack_5ef,local_5f0) + 1);
      }
    }
    local_5e0 = local_5e0 + 1;
  } while( true );
}

Assistant:

void LongReadsDatastore::build_from_fastq(const std::string &output_file, const std::string &default_name, const std::string &long_read_file, size_t min_size, int rle) {
    uint64_t nReads(1);
    std::vector<ReadPosSize> read_to_file_record{ReadPosSize{0,0}};
    std::ofstream ofs(output_file, std::ios_base::out | std::ios_base::trunc | std::ios_base::binary);
    if (!ofs) {
        std::cerr << "Failed to open output in " << output_file <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + output_file);
    }
    uint64_t fPos;
    ofs.write((const char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    ofs.write((const char *) &SDG_VN, sizeof(min_compat));
    SDG_FILETYPE type(LongDS_FT);
    ofs.write((char *) &type, sizeof(type));

    ofs.write((char*) &nReads, sizeof(nReads));
    ofs.write((char*) &fPos, sizeof(fPos));

    sdglib::write_string(ofs, default_name);

    std::ifstream fastq_ifstream(long_read_file);
    if (!fastq_ifstream) {
        std::cerr << "Failed to open input in " << long_read_file << ": " << strerror(errno);
        throw std::runtime_error("Could not open " + long_read_file);
    }
    FastqReader<FastqRecord> reader({}, long_read_file);
    FastqRecord rec;
    while(reader.next_record(rec)) {
        if (!rec.seq.empty() and (min_size==0 or rec.seq.size()>=min_size)) {

            std::string rleseq;
            rleseq.reserve(rec.seq.size());
            char last_char=' ';
            int run_size=0;

            for (auto c:rec.seq){
                switch (c){
                    case 'A':
                    case 'C':
                    case 'G':
                    case 'T':
                        break;
                    case 'a':
                        c='A';
                        break;
                    case 'c':
                        c='C';
                        break;
                    case 'g':
                        c='G';
                        break;
                    case 't':
                        c='T';
                        break;
                    default:
                        c='N';
                }
                if (rle==0) {
                    rleseq.push_back(c);
                }
                else {
                    if (c==last_char) {
                        ++run_size;
                    }
                    else {
                        last_char=c;
                        run_size=1;
                    }
                    if (run_size<=rle) rleseq.push_back(c);
                }
            }

            uint32_t size = rleseq.size();
            auto offset = ofs.tellp();
            read_to_file_record.emplace_back((off_t)offset,size);
            ofs.write((char*)rleseq.c_str(), size+1);//+1 writes the \0

        }
        ++nReads;
    }
    fPos = ofs.tellp();                             // Write position after reads
    sdglib::write_flat_vector(ofs, read_to_file_record);

    // Write empty mappings
    uint8_t k(0);
    ofs.write(reinterpret_cast<const char *>(&k), sizeof(k));
    std::vector<LongReadMapping> mappings;
    sdglib::write_flat_vector(ofs, mappings);

    ofs.seekp(sizeof(SDG_MAGIC)+sizeof(SDG_VN)+sizeof(type));                                   // Go to top and dump # reads and position of index
    ofs.write((char*) &nReads, sizeof(nReads));     // Dump # of reads
    ofs.write((char*) &fPos, sizeof(fPos));         // Dump index

    ofs.flush();                                    // Make sure everything has been written
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Built datastore with "<<read_to_file_record.size()-1<<" reads"<<std::endl;
}